

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QByteArray> * __thiscall
QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::operator[]
          (QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *this,KnownHeaders *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>,_bool>
  pVar3;
  iterator i;
  QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> copy;
  map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
  *in_stack_ffffffffffffff48;
  QList<QByteArray> *pQVar4;
  QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *in_stack_ffffffffffffff50;
  map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
  *this_00;
  map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
  local_68;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff50->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff50,
         (QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *)in_stack_ffffffffffffff48);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *)0x1f95cf);
  }
  detach(in_stack_ffffffffffffff50);
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
                *)0x1f95f2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0x1f9603);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
                *)0x1f9615);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
       ::end(in_stack_ffffffffffffff48);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
                  *)0x1f9651);
    local_68._M_t._M_impl._0_8_ = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    this_00 = &local_68;
    QList<QByteArray>::QList((QList<QByteArray> *)0x1f9684);
    std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::
    pair<QList<QByteArray>,_true>
              (in_RSI,(KnownHeaders *)in_stack_ffffffffffffff48,(QList<QByteArray> *)0x1f969d);
    pVar3 = std::
            map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>
            ::insert(this_00,in_RSI);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::~pair
              ((pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *)0x1f96e7);
    QList<QByteArray>::~QList((QList<QByteArray> *)0x1f96f1);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>::
           operator->((_Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>
                       *)0x1f96fe);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *)0x1f9713);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }